

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O3

bool IsLocalScope(ScopeData *scope)

{
  if ((scope != (ScopeData *)0x0) && (scope->type != SCOPE_TEMPORARY)) {
    do {
      if (scope->ownerFunction != (FunctionData *)0x0) {
        return true;
      }
      if (scope->ownerType != (TypeBase *)0x0) {
        return true;
      }
      scope = scope->scope;
    } while (scope != (ScopeData *)0x0);
  }
  return false;
}

Assistant:

bool IsLocalScope(ScopeData *scope)
{
	if(!scope)
		return false;

	if(scope->type == SCOPE_TEMPORARY)
		return false;

	// Not a global scope if there is an enclosing function or a type
	while(scope)
	{
		if(scope->ownerFunction || scope->ownerType)
			return true;

		scope = scope->scope;
	}

	return false;
}